

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O2

string * __thiscall
OpenGliderConnection::GetURL_abi_cxx11_
          (string *__return_storage_ptr__,OpenGliderConnection *this,positionTy *pos)

{
  char url [128];
  boundingBoxTy box;
  allocator<char> local_129;
  char local_128 [128];
  boundingBoxTy local_a8;
  
  boundingBoxTy::boundingBoxTy(&local_a8,pos,(double)(dataRefs.fdStdDistance * 0x73c) * 1.1,NAN);
  local_128[0x70] = '\0';
  local_128[0x71] = '\0';
  local_128[0x72] = '\0';
  local_128[0x73] = '\0';
  local_128[0x74] = '\0';
  local_128[0x75] = '\0';
  local_128[0x76] = '\0';
  local_128[0x77] = '\0';
  local_128[0x78] = '\0';
  local_128[0x79] = '\0';
  local_128[0x7a] = '\0';
  local_128[0x7b] = '\0';
  local_128[0x7c] = '\0';
  local_128[0x7d] = '\0';
  local_128[0x7e] = '\0';
  local_128[0x7f] = '\0';
  local_128[0x60] = '\0';
  local_128[0x61] = '\0';
  local_128[0x62] = '\0';
  local_128[99] = '\0';
  local_128[100] = '\0';
  local_128[0x65] = '\0';
  local_128[0x66] = '\0';
  local_128[0x67] = '\0';
  local_128[0x68] = '\0';
  local_128[0x69] = '\0';
  local_128[0x6a] = '\0';
  local_128[0x6b] = '\0';
  local_128[0x6c] = '\0';
  local_128[0x6d] = '\0';
  local_128[0x6e] = '\0';
  local_128[0x6f] = '\0';
  local_128[0x50] = '\0';
  local_128[0x51] = '\0';
  local_128[0x52] = '\0';
  local_128[0x53] = '\0';
  local_128[0x54] = '\0';
  local_128[0x55] = '\0';
  local_128[0x56] = '\0';
  local_128[0x57] = '\0';
  local_128[0x58] = '\0';
  local_128[0x59] = '\0';
  local_128[0x5a] = '\0';
  local_128[0x5b] = '\0';
  local_128[0x5c] = '\0';
  local_128[0x5d] = '\0';
  local_128[0x5e] = '\0';
  local_128[0x5f] = '\0';
  local_128[0x40] = '\0';
  local_128[0x41] = '\0';
  local_128[0x42] = '\0';
  local_128[0x43] = '\0';
  local_128[0x44] = '\0';
  local_128[0x45] = '\0';
  local_128[0x46] = '\0';
  local_128[0x47] = '\0';
  local_128[0x48] = '\0';
  local_128[0x49] = '\0';
  local_128[0x4a] = '\0';
  local_128[0x4b] = '\0';
  local_128[0x4c] = '\0';
  local_128[0x4d] = '\0';
  local_128[0x4e] = '\0';
  local_128[0x4f] = '\0';
  local_128[0x30] = '\0';
  local_128[0x31] = '\0';
  local_128[0x32] = '\0';
  local_128[0x33] = '\0';
  local_128[0x34] = '\0';
  local_128[0x35] = '\0';
  local_128[0x36] = '\0';
  local_128[0x37] = '\0';
  local_128[0x38] = '\0';
  local_128[0x39] = '\0';
  local_128[0x3a] = '\0';
  local_128[0x3b] = '\0';
  local_128[0x3c] = '\0';
  local_128[0x3d] = '\0';
  local_128[0x3e] = '\0';
  local_128[0x3f] = '\0';
  local_128[0x20] = '\0';
  local_128[0x21] = '\0';
  local_128[0x22] = '\0';
  local_128[0x23] = '\0';
  local_128[0x24] = '\0';
  local_128[0x25] = '\0';
  local_128[0x26] = '\0';
  local_128[0x27] = '\0';
  local_128[0x28] = '\0';
  local_128[0x29] = '\0';
  local_128[0x2a] = '\0';
  local_128[0x2b] = '\0';
  local_128[0x2c] = '\0';
  local_128[0x2d] = '\0';
  local_128[0x2e] = '\0';
  local_128[0x2f] = '\0';
  local_128[0x10] = '\0';
  local_128[0x11] = '\0';
  local_128[0x12] = '\0';
  local_128[0x13] = '\0';
  local_128[0x14] = '\0';
  local_128[0x15] = '\0';
  local_128[0x16] = '\0';
  local_128[0x17] = '\0';
  local_128[0x18] = '\0';
  local_128[0x19] = '\0';
  local_128[0x1a] = '\0';
  local_128[0x1b] = '\0';
  local_128[0x1c] = '\0';
  local_128[0x1d] = '\0';
  local_128[0x1e] = '\0';
  local_128[0x1f] = '\0';
  local_128[0] = '\0';
  local_128[1] = '\0';
  local_128[2] = '\0';
  local_128[3] = '\0';
  local_128[4] = '\0';
  local_128[5] = '\0';
  local_128[6] = '\0';
  local_128[7] = '\0';
  local_128[8] = '\0';
  local_128[9] = '\0';
  local_128[10] = '\0';
  local_128[0xb] = '\0';
  local_128[0xc] = '\0';
  local_128[0xd] = '\0';
  local_128[0xe] = '\0';
  local_128[0xf] = '\0';
  snprintf(local_128,0x80,"http://live.glidernet.org/lxml.php?a=0&b=%.3f&c=%.3f&d=%.3f&e=%.3f",
           local_a8.nw._lat,local_a8.se._lat,local_a8.se._lon,local_a8.nw._lon);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_128,&local_129);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenGliderConnection::GetURL (const positionTy& pos)
{
    // Bounding box the size of the configured distance...plus 10% so we have data in hand once the plane comes close enough
    boundingBoxTy box (pos, double(dataRefs.GetFdStdDistance_m()) * 1.10 );
    char url[128] = "";
    snprintf(url, sizeof(url),
             OPGLIDER_URL,
             box.nw.lat(),              // lamax
             box.se.lat(),              // lamin
             box.se.lon(),              // lomax
             box.nw.lon());             // lomin
    return std::string(url);
}